

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::Curve::Curve(Curve *this,SP *material)

{
  SP *in_RDI;
  shared_ptr<pbrt::Material> *in_stack_ffffffffffffffb8;
  affine3f *this_00;
  Shape *in_stack_ffffffffffffffd0;
  
  this_00 = (affine3f *)&stack0xffffffffffffffe0;
  std::shared_ptr<pbrt::Material>::shared_ptr
            ((shared_ptr<pbrt::Material> *)this_00,in_stack_ffffffffffffffb8);
  Shape::Shape(in_stack_ffffffffffffffd0,in_RDI);
  std::shared_ptr<pbrt::Material>::~shared_ptr((shared_ptr<pbrt::Material> *)0x1e5860);
  (in_RDI->super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR_toString_abi_cxx11__0029c228;
  math::affine3f::affine3f(this_00);
  *(undefined1 *)
   ((long)&in_RDI[10].super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 2) = 3
  ;
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::vector
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)0x1e5896);
  *(undefined4 *)&in_RDI[0xc].super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = 0x3f800000;
  *(undefined4 *)
   ((long)&in_RDI[0xc].super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       0x3f800000;
  return;
}

Assistant:

Curve(Material::SP material=Material::SP()) : Shape(material) {}